

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nnls.h
# Opt level: O2

Scalar __thiscall
Eigen::NNLS<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::_max_Z
          (NNLS<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *this,RowVectorType *v)

{
  float fVar1;
  Index index;
  CoeffReturnType plVar2;
  float *pfVar3;
  CoeffReturnType pfVar4;
  Index index_00;
  
  plVar2 = DenseCoeffsBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>,_0> *)&this->_P,
                      this->_Np);
  pfVar3 = DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0> *)v,*plVar2);
  index_00 = this->_Np;
  do {
    fVar1 = *pfVar3;
    do {
      index_00 = index_00 + 1;
      if ((this->_A).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols <= index_00) {
        return fVar1;
      }
      plVar2 = DenseCoeffsBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>,_0> *)&this->_P,
                          index_00);
      index = *plVar2;
      pfVar4 = DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0> *)v,index);
    } while (*pfVar4 <= fVar1);
    pfVar3 = DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0> *)v,index);
  } while( true );
}

Assistant:

Scalar _max_Z(const RowVectorType &v) {
    const IndicesType &idxs = _P.indices();
    Scalar m = v(idxs(_Np));
    for (Index i=(_Np+1); i<_A.cols(); i++) {
      Index idx = idxs(i);
      if (m < v(idx)) { m = v(idx);}
    }
    return m;
  }